

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  SegmentReader *pSVar1;
  word *pwVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  ulong uVar8;
  WirePointer *pWVar9;
  PointerType PVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  WirePointer *pWVar15;
  Fault f;
  Fault local_20;
  undefined8 *puVar7;
  
  pWVar14 = this->pointer;
  if (pWVar14 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar6 = (pWVar14->offsetAndKind).value;
  if ((pWVar14->field_1).upper32Bits == 0 && uVar6 == 0) {
    return NULL_;
  }
  pSVar1 = this->segment;
  if (pSVar1 == (SegmentReader *)0x0) {
LAB_0027a455:
    switch(uVar6 & 3) {
    case 0:
      PVar10 = STRUCT;
      break;
    case 1:
      PVar10 = LIST;
      break;
    case 2:
      PVar10 = NULL_;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xaad,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                 (char (*) [26])"far pointer not followed?");
      kj::_::Debug::Fault::~Fault(&local_20);
      break;
    case 3:
      if (uVar6 == 3) {
        return CAPABILITY;
      }
      getPointerType();
      goto LAB_0027a4e1;
    }
  }
  else {
    lVar11 = (long)((int)uVar6 >> 2);
    pwVar2 = (pSVar1->ptr).ptr;
    pWVar15 = (WirePointer *)(pwVar2 + (pSVar1->ptr).size_);
    pWVar9 = pWVar14 + lVar11 + 1;
    if ((long)pWVar15 - (long)(pWVar14 + 1) >> 3 < lVar11) {
      pWVar9 = pWVar15;
    }
    if (lVar11 < (long)pwVar2 - (long)(pWVar14 + 1) >> 3) {
      pWVar9 = pWVar15;
    }
    if ((uVar6 & 3) != 2) {
LAB_0027a44a:
      pWVar15 = pWVar14;
      if (pWVar9 == (WirePointer *)0x0) {
        return NULL_;
      }
LAB_0027a452:
      uVar6 = (pWVar15->offsetAndKind).value;
      goto LAB_0027a455;
    }
    iVar5 = (*pSVar1->arena->_vptr_Arena[2])();
    puVar7 = (undefined8 *)CONCAT44(extraout_var,iVar5);
    if (puVar7 == (undefined8 *)0x0) {
      getPointerType();
    }
    else {
      uVar8 = puVar7[3];
      uVar6 = (pWVar14->offsetAndKind).value;
      uVar12 = (ulong)(uVar6 >> 3);
      if ((long)uVar8 < (long)(ulong)(uVar6 >> 3)) {
        uVar12 = uVar8;
      }
      uVar13 = 2 - (ulong)((uVar6 & 4) == 0);
      if (uVar12 + uVar13 <= uVar8) {
        lVar11 = puVar7[2];
        plVar3 = (long *)*puVar7;
        uVar4 = *(ulong *)puVar7[4];
        if (uVar13 <= uVar4) {
          pWVar15 = (WirePointer *)(lVar11 + uVar12 * 8);
          pWVar14 = pWVar15 + 1;
          *(ulong *)puVar7[4] = uVar4 - uVar13;
          if ((uVar6 & 4) == 0) {
            uVar6 = (pWVar15->offsetAndKind).value;
            if ((lVar11 - (long)pWVar14 >> 3 <= (long)((int)uVar6 >> 2)) &&
               ((long)((int)uVar6 >> 2) <= (long)((lVar11 + uVar8 * 8) - (long)pWVar14) >> 3))
            goto LAB_0027a455;
            goto LAB_0027a452;
          }
          lVar11 = (**(code **)(*plVar3 + 0x10))(plVar3,(pWVar15->field_1).upper32Bits);
          if (lVar11 == 0) {
            getPointerType();
          }
          else {
            uVar6 = (pWVar15->offsetAndKind).value;
            if ((uVar6 & 3) == 2) {
              uVar8 = (ulong)(uVar6 >> 3);
              if ((long)*(ulong *)(lVar11 + 0x18) < (long)uVar8) {
                uVar8 = *(ulong *)(lVar11 + 0x18);
              }
              pWVar9 = (WirePointer *)(uVar8 * 8 + *(long *)(lVar11 + 0x10));
              goto LAB_0027a44a;
            }
            getPointerType();
          }
          goto LAB_0027a4e1;
        }
        (**(code **)(*plVar3 + 0x18))();
      }
      getPointerType();
    }
LAB_0027a4e1:
    PVar10 = NULL_;
  }
  return PVar10;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == nullptr) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}